

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_4UL,_16384UL>
::addOrFree(BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_4UL,_16384UL>
            *this,void *ptr,size_t numBytes)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  if (numBytes < 0x40) {
    free(ptr);
    return;
  }
  uVar3 = (numBytes - 8) / 0x38;
  *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ***)ptr = this->mListForFree;
  this->mListForFree =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        **)ptr;
  if (0x37 < numBytes - 8) {
    uVar2 = uVar3 + (uVar3 == 0) + 7 & 0xffffffffffffff8;
    auVar4 = vpbroadcastq_avx512f();
    auVar5 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar6 = vpbroadcastq_avx512f(ZEXT816(0x38));
    auVar7 = vpbroadcastq_avx512f();
    auVar7 = vpaddq_avx512f(auVar7,auVar6);
    auVar8 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar1 = vpcmpuq_avx512f(auVar5,auVar4,2);
      auVar9 = vpmullq_avx512dq(auVar5,auVar6);
      auVar10 = vpaddq_avx512f(auVar9,auVar7);
      vpscatterqq_avx512f(ZEXT864((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)ptr + 8U)) + auVar9,uVar1,auVar10);
      auVar5 = vpaddq_avx512f(auVar5,auVar8);
      uVar2 = uVar2 - 8;
    } while (uVar2 != 0);
  }
  *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    **)((long)ptr + uVar3 * 0x38 + -0x30) = this->mHead;
  this->mHead = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)ptr + 8U);
  return;
}

Assistant:

void addOrFree(void* ptr, const size_t numBytes) noexcept {
        // calculate number of available elements in ptr
        if (numBytes < ALIGNMENT + ALIGNED_SIZE) {
            // not enough data for at least one element. Free and return.
            ROBIN_HOOD_LOG("std::free")
            std::free(ptr);
        } else {
            ROBIN_HOOD_LOG("add to buffer")
            add(ptr, numBytes);
        }
    }